

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDiurnal_kry_bp.c
# Opt level: O3

void PrintFinalStats(void *cvode_mem)

{
  uint uVar1;
  long nfeBP;
  long nfeLS;
  long ncfl;
  long nps;
  long npe;
  long nli;
  long netf;
  long ncfn;
  long nni;
  long nsetups;
  long nfe;
  long nst;
  long leniwBP;
  long lenrwBP;
  long leniwLS;
  long lenrwLS;
  long leniw;
  long lenrw;
  long local_98;
  long local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  long local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  uVar1 = CVodeGetWorkSpace(cvode_mem,&local_10,&local_18);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetWorkSpace",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumSteps(cvode_mem,&local_40);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumSteps",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumRhsEvals(cvode_mem,&local_48);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumRhsEvals",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumLinSolvSetups(cvode_mem,&local_50);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumLinSolvSetups",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumErrTestFails(cvode_mem,&local_68);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumErrTestFails",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumNonlinSolvIters(cvode_mem,&local_58);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
            "CVodeGetNumNonlinSolvIters",(ulong)uVar1);
  }
  uVar1 = CVodeGetNumNonlinSolvConvFails(cvode_mem,&local_60);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
            "CVodeGetNumNonlinSolvConvFails",(ulong)uVar1);
  }
  uVar1 = CVodeGetLinWorkSpace(cvode_mem,&local_20,&local_28);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetLinWorkSpace",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumLinIters(cvode_mem,&local_70);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumLinIters",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumPrecEvals(cvode_mem,&local_78);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumPrecEvals",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumPrecSolves(cvode_mem,&local_80);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumPrecSolves",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumLinConvFails(cvode_mem,&local_88);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumLinConvFails",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumLinRhsEvals(cvode_mem,&local_90);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumLinRhsEvals",
            (ulong)uVar1);
  }
  uVar1 = CVBandPrecGetWorkSpace(cvode_mem,&local_30,&local_38);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVBandPrecGetWorkSpace",
            (ulong)uVar1);
  }
  uVar1 = CVBandPrecGetNumRhsEvals(cvode_mem,&local_98);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVBandPrecGetNumRhsEvals",
            (ulong)uVar1);
  }
  puts("\nFinal Statistics.. \n");
  printf("lenrw   = %5ld     leniw   = %5ld\n",local_10,local_18);
  printf("lenrwls = %5ld     leniwls = %5ld\n",local_20,local_28);
  printf("lenrwbp = %5ld     leniwbp = %5ld\n",local_30,local_38);
  printf("nst     = %5ld\n",local_40);
  printf("nfe     = %5ld     nfetot  = %5ld\n",local_48,local_90 + local_48 + local_98);
  printf("nfeLS   = %5ld     nfeBP   = %5ld\n",local_90,local_98);
  printf("nni     = %5ld     nli     = %5ld\n",local_58,local_70);
  printf("nsetups = %5ld     netf    = %5ld\n",local_50,local_68);
  printf("npe     = %5ld     nps     = %5ld\n",local_78,local_80);
  printf("ncfn    = %5ld     ncfl    = %5ld\n\n",local_60,local_88);
  return;
}

Assistant:

static void PrintFinalStats(void* cvode_mem)
{
  long int lenrw, leniw;
  long int lenrwLS, leniwLS;
  long int lenrwBP, leniwBP;
  long int nst, nfe, nsetups, nni, ncfn, netf;
  long int nli, npe, nps, ncfl, nfeLS;
  long int nfeBP;
  int retval;

  retval = CVodeGetWorkSpace(cvode_mem, &lenrw, &leniw);
  check_retval(&retval, "CVodeGetWorkSpace", 1);
  retval = CVodeGetNumSteps(cvode_mem, &nst);
  check_retval(&retval, "CVodeGetNumSteps", 1);
  retval = CVodeGetNumRhsEvals(cvode_mem, &nfe);
  check_retval(&retval, "CVodeGetNumRhsEvals", 1);
  retval = CVodeGetNumLinSolvSetups(cvode_mem, &nsetups);
  check_retval(&retval, "CVodeGetNumLinSolvSetups", 1);
  retval = CVodeGetNumErrTestFails(cvode_mem, &netf);
  check_retval(&retval, "CVodeGetNumErrTestFails", 1);
  retval = CVodeGetNumNonlinSolvIters(cvode_mem, &nni);
  check_retval(&retval, "CVodeGetNumNonlinSolvIters", 1);
  retval = CVodeGetNumNonlinSolvConvFails(cvode_mem, &ncfn);
  check_retval(&retval, "CVodeGetNumNonlinSolvConvFails", 1);

  retval = CVodeGetLinWorkSpace(cvode_mem, &lenrwLS, &leniwLS);
  check_retval(&retval, "CVodeGetLinWorkSpace", 1);
  retval = CVodeGetNumLinIters(cvode_mem, &nli);
  check_retval(&retval, "CVodeGetNumLinIters", 1);
  retval = CVodeGetNumPrecEvals(cvode_mem, &npe);
  check_retval(&retval, "CVodeGetNumPrecEvals", 1);
  retval = CVodeGetNumPrecSolves(cvode_mem, &nps);
  check_retval(&retval, "CVodeGetNumPrecSolves", 1);
  retval = CVodeGetNumLinConvFails(cvode_mem, &ncfl);
  check_retval(&retval, "CVodeGetNumLinConvFails", 1);
  retval = CVodeGetNumLinRhsEvals(cvode_mem, &nfeLS);
  check_retval(&retval, "CVodeGetNumLinRhsEvals", 1);

  retval = CVBandPrecGetWorkSpace(cvode_mem, &lenrwBP, &leniwBP);
  check_retval(&retval, "CVBandPrecGetWorkSpace", 1);
  retval = CVBandPrecGetNumRhsEvals(cvode_mem, &nfeBP);
  check_retval(&retval, "CVBandPrecGetNumRhsEvals", 1);

  printf("\nFinal Statistics.. \n\n");
  printf("lenrw   = %5ld     leniw   = %5ld\n", lenrw, leniw);
  printf("lenrwls = %5ld     leniwls = %5ld\n", lenrwLS, leniwLS);
  printf("lenrwbp = %5ld     leniwbp = %5ld\n", lenrwBP, leniwBP);
  printf("nst     = %5ld\n", nst);
  printf("nfe     = %5ld     nfetot  = %5ld\n", nfe, nfe + nfeLS + nfeBP);
  printf("nfeLS   = %5ld     nfeBP   = %5ld\n", nfeLS, nfeBP);
  printf("nni     = %5ld     nli     = %5ld\n", nni, nli);
  printf("nsetups = %5ld     netf    = %5ld\n", nsetups, netf);
  printf("npe     = %5ld     nps     = %5ld\n", npe, nps);
  printf("ncfn    = %5ld     ncfl    = %5ld\n\n", ncfn, ncfl);
}